

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O3

void __thiscall
IntrusiveListTest_push_front_move_Test::TestBody(IntrusiveListTest_push_front_move_Test *this)

{
  _Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  _Var1;
  int iVar2;
  __uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  _Var3;
  __uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  *p_Var4;
  _Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false> _Var5;
  TestObject *pTVar6;
  vector<int,_std::allocator<int>_> *expected;
  TestObject *node_p;
  TestObject *node_p_1;
  TestObjectList local_58;
  IntrusiveListTest local_40;
  undefined8 local_30;
  
  iVar2 = (anonymous_namespace)::TestObject::creation_count;
  _Var3._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (tuple<testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
        )operator_new(0x20);
  *(undefined8 *)
   _Var3._M_t.
   super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
   .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0;
  *(undefined1 *)
   ((long)_Var3._M_t.
          super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
          .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl + 0x18) =
       0;
  *(undefined8 *)
   ((long)_Var3._M_t.
          super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
          .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl + 0x10) =
       1;
  local_40.super_Test.gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (__uniq_ptr_data<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>,_true,_true>
        )(__uniq_ptr_data<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>,_true,_true>
          )_Var3._M_t.
           super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
           .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl;
  p_Var4 = (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
            *)operator_new(0x20);
  *(code *)&p_Var4[3]._M_t = (code)0x0;
  p_Var4[2]._M_t =
       (tuple<testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
        )0x2;
  p_Var4->_M_t = _Var3._M_t.
                 super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                 .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl;
  *(__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    **)((long)_Var3._M_t.
              super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
              .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl + 8) =
       p_Var4;
  (anonymous_namespace)::TestObject::creation_count = iVar2 + 3;
  _Var5._M_head_impl = (GTestFlagSaver *)operator_new(0x20);
  *(_func_int **)((long)_Var5._M_head_impl + 8) = (_func_int *)0x0;
  *(undefined1 *)((long)_Var5._M_head_impl + 0x18) = 0;
  *(_func_int **)((long)_Var5._M_head_impl + 0x10) = (_func_int *)0x3;
  *(__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    **)_Var5._M_head_impl = p_Var4;
  p_Var4[1]._M_t =
       (tuple<testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
        )_Var5._M_head_impl;
  local_30 = 3;
  local_40.super_Test._vptr_Test = (_func_int **)_Var5._M_head_impl;
  pTVar6 = (TestObject *)operator_new(0xc);
  local_58.last_ =
       (TestObject *)
       ((long)&(pTVar6->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ + 4);
  (pTVar6->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)0x200000003;
  *(undefined4 *)&(pTVar6->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = 1;
  local_58.first_ = pTVar6;
  local_58.size_ = (size_t)local_58.last_;
  anon_unknown.dwarf_685c1::IntrusiveListTest::AssertListEq(&local_40,&local_58,expected);
  operator_delete(pTVar6,0xc);
  do {
    if (*(char *)((long)&(_Var5._M_head_impl)->color_ + 0x10) == '\0') {
      (anonymous_namespace)::TestObject::creation_count =
           (anonymous_namespace)::TestObject::creation_count + -1;
    }
    _Var1.super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
         *(_Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false> *)_Var5._M_head_impl;
    operator_delete(_Var5._M_head_impl,0x20);
    _Var5 = _Var1.super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl;
  } while (_Var1.super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl !=
           (GTestFlagSaver *)0x0);
  return;
}

Assistant:

TestObject(int data = 0, int data2 = 0) : data(data), data2(data2) {
    ++creation_count;
  }